

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O2

Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
yaml::Mapping::getInt
          (Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Mapping *this,string *name)

{
  reference_wrapper<const_yaml::Value> *prVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ExpectedRef<const_Value,_std::string> value_result;
  ExpectedRef<const_Value,_std::string> EStack_58;
  string local_30 [32];
  
  getValue(&EStack_58,this,name);
  if (EStack_58.has_value_ == false) {
    pbVar2 = Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&EStack_58);
    std::__cxx11::string::string(local_30,(string *)pbVar2);
    Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)local_30);
    std::__cxx11::string::~string(local_30);
  }
  else {
    prVar1 = Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&EStack_58);
    Value::getInt_abi_cxx11_(__return_storage_ptr__,prVar1->_M_data);
  }
  Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&EStack_58);
  return __return_storage_ptr__;
}

Assistant:

Expected<long int, std::string> Mapping::getInt(const std::string &name) const {
	const auto value_result = getValue(name);
	if (!value_result)
		return Unexpected(value_result.error());

	return value_result.value().get().getInt();
}